

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O3

void inproc_pipe_send(void *arg,nni_aio *aio)

{
  inproc_queue *queue;
  _Bool _Var1;
  
  queue = *(inproc_queue **)((long)arg + 0x18);
  nni_aio_reset(aio);
  nni_mtx_lock(&queue->lock);
  _Var1 = nni_aio_start(aio,inproc_queue_cancel,queue);
  if (_Var1) {
    nni_aio_list_append(&queue->writers,aio);
    inproc_queue_run(queue);
  }
  nni_mtx_unlock(&queue->lock);
  return;
}

Assistant:

static void
inproc_pipe_send(void *arg, nni_aio *aio)
{
	inproc_pipe  *pipe  = arg;
	inproc_queue *queue = pipe->send_queue;

	nni_aio_reset(aio);

	nni_mtx_lock(&queue->lock);
	if (!nni_aio_start(aio, inproc_queue_cancel, queue)) {
		nni_mtx_unlock(&queue->lock);
		return;
	}
	nni_aio_list_append(&queue->writers, aio);
	inproc_queue_run(queue);
	nni_mtx_unlock(&queue->lock);
}